

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# target.c
# Opt level: O2

point_set * target_get_monsters(wchar_t mode,monster_predicate pred,_Bool restrict_to_panel)

{
  loc *base;
  point_set *ppVar1;
  _Bool _Var2;
  int iVar3;
  loc grid;
  monster *m;
  uint uVar4;
  undefined7 in_register_00000011;
  wchar_t x;
  wchar_t y;
  wchar_t max_x;
  wchar_t max_y;
  wchar_t min_x;
  wchar_t min_y;
  monster_predicate local_40;
  point_set *local_38;
  
  local_40 = pred;
  local_38 = (point_set *)point_set_new(0x14);
  if ((int)CONCAT71(in_register_00000011,restrict_to_panel) == 0) {
    iVar3 = (player->grid).y;
    uVar4 = (uint)z_info->max_range;
    max_y = uVar4 + iVar3 + L'\x01';
    y = iVar3 - uVar4;
    iVar3 = (player->grid).x;
    max_x = uVar4 + iVar3 + L'\x01';
    min_x = iVar3 - uVar4;
    min_y = y;
  }
  else {
    get_panel(&min_y,&min_x,&max_y,&max_x);
    y = min_y;
  }
  for (; ppVar1 = local_38, x = min_x, y < max_y; y = y + L'\x01') {
    for (; x < max_x; x = x + L'\x01') {
      grid = (loc)loc(x,y);
      _Var2 = square_in_bounds_fully(cave,grid);
      if (((_Var2) && (_Var2 = target_accept(y,x), _Var2)) &&
         (((mode & 1U) == 0 ||
          (((m = square_monster(cave,grid), m != (monster *)0x0 && (_Var2 = target_able(m), _Var2))
           && ((local_40 == (monster_predicate)0x0 || (_Var2 = (*local_40)(m), _Var2)))))))) {
        add_to_point_set((point_set_conflict *)local_38,(loc_conflict)grid);
      }
    }
  }
  base = local_38->pts;
  iVar3 = point_set_size((point_set_conflict *)local_38);
  sort(base,(long)iVar3,8,cmp_distance);
  return ppVar1;
}

Assistant:

struct point_set *target_get_monsters(int mode, monster_predicate pred,
		bool restrict_to_panel)
{
	int y, x;
	int min_y, min_x, max_y, max_x;
	struct point_set *targets = point_set_new(TS_INITIAL_SIZE);

	if (restrict_to_panel) {
		/* Get the current panel */
		get_panel(&min_y, &min_x, &max_y, &max_x);
	} else {
		min_y = player->grid.y - z_info->max_range;
		max_y = player->grid.y + z_info->max_range + 1;
		min_x = player->grid.x - z_info->max_range;
		max_x = player->grid.x + z_info->max_range + 1;
	}

	/* Scan for targets */
	for (y = min_y; y < max_y; y++) {
		for (x = min_x; x < max_x; x++) {
			struct loc grid = loc(x, y);

			/* Check bounds */
			if (!square_in_bounds_fully(cave, grid)) continue;

			/* Require "interesting" contents */
			if (!target_accept(y, x)) continue;

			/* Special mode */
			if (mode & (TARGET_KILL)) {
				struct monster *mon = square_monster(cave, grid);

				/* Must contain a monster */
				if (mon == NULL) continue;

				/* Must be a targettable monster */
				if (!target_able(mon)) continue;

				/* Must be the right sort of monster */
				if (pred && !pred(mon)) continue;
			}

			/* Save the location */
			add_to_point_set(targets, grid);
		}
	}

	sort(targets->pts, point_set_size(targets), sizeof(*(targets->pts)),
		 cmp_distance);
	return targets;
}